

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsOnListOfPiecesOfCinematography.h
# Opt level: O3

void OperationsOnListOfPiecesOfCinematography<Series>::addPiece
               (Series *piece,
               vector<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_> *list)

{
  pointer *pppPVar1;
  iterator __position;
  PieceOfCinematography *pPVar2;
  int iVar3;
  int iVar4;
  istream *piVar5;
  pointer ppPVar6;
  Series *this;
  Livestream *this_00;
  CustomException *pCVar7;
  char *pcVar8;
  bool bVar9;
  double rating;
  string inputValue;
  string hour;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  genres;
  string title;
  string genre;
  char *local_248;
  undefined8 local_240;
  char local_238 [16];
  Series *local_228;
  ulong local_220;
  undefined1 local_218 [24];
  undefined8 uStack_200;
  _Alloc_hider local_1f8;
  char *local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  value_type local_1d0;
  string local_1b0;
  char *local_190 [2];
  char local_180 [16];
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  char *local_50 [2];
  char local_40 [16];
  
  local_1f0 = local_1e8._M_local_buf + 8;
  local_1e8._M_allocated_capacity = 0;
  local_1e8._M_local_buf[8] = '\0';
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_local_buf[0] = '\0';
  local_248 = local_238;
  local_240 = 0;
  local_238[0] = '\0';
  local_1f8._M_p = (pointer)0x0;
  local_218._16_8_ = 0.0;
  uStack_200._0_4_ = 0;
  uStack_200._4_4_ = 0;
  PieceOfCinematography::setFollowed(&piece->super_PieceOfCinematography,false);
  PieceOfCinematography::setId
            (&piece->super_PieceOfCinematography,
             (int)((ulong)((long)(list->
                                 super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(list->
                                super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) + 1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"set the title of the piece of cinematography:",0x2d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_1f0);
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,local_1f0,local_1f0 + local_1e8._M_allocated_capacity);
  PieceOfCinematography::setTitle(&piece->super_PieceOfCinematography,&local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"set the rating for the piece of cinematography:",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_248);
  rating = atof(local_248);
  if ((10.0 < rating) || (rating < 0.0)) {
    pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"wrong rating","");
    CustomException::CustomException(pCVar7,&local_70);
    __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setRating(&piece->super_PieceOfCinematography,rating);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"set the number of votes for the piece of cinematography:",0x38);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_248);
  iVar3 = atoi(local_248);
  if (iVar3 < 0) {
    pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Number of votes can not be lower than 0","");
    CustomException::CustomException(pCVar7,&local_90);
    __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setNumberOfVotes(&piece->super_PieceOfCinematography,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"set the year of production for the piece of cinematography:",
             0x3b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_248);
  iVar3 = atoi(local_248);
  if (iVar3 < 0) {
    pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b0,"Year of production can not be lower than 0","");
    CustomException::CustomException(pCVar7,&local_b0);
    __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setYearProduced(&piece->super_PieceOfCinematography,iVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"set the duration of the piece of cinematography:",0x30);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::operator>>((istream *)&std::cin,(string *)&local_248);
  iVar4 = atoi(local_248);
  if (iVar4 < 0) {
    pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"Duration can not be lower than 0","");
    CustomException::CustomException(pCVar7,&local_d0);
    __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
  }
  PieceOfCinematography::setDuration(&piece->super_PieceOfCinematography,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"set the genres of the piece of cinematography:",0x2e);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To set each genre type it and then press enter.",0x2f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"To finish setting the genres type \"apply\" and press enter.",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
  std::ostream::put(-0x80);
  std::ostream::flush();
  while ((piVar5 = std::operator>>((istream *)&std::cin,(string *)&local_1d0),
         ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0 &&
         (iVar4 = std::__cxx11::string::compare((char *)&local_1d0), iVar4 != 0))) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_218 + 0x10),&local_1d0);
  }
  PieceOfCinematography::setGenres
            (&piece->super_PieceOfCinematography,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_218 + 0x10));
  __position._M_current =
       (list->super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>)
       ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = piece;
  if (__position._M_current ==
      (list->super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<PieceOfCinematography*,std::allocator<PieceOfCinematography*>>::
    _M_realloc_insert<PieceOfCinematography*>
              ((vector<PieceOfCinematography*,std::allocator<PieceOfCinematography*>> *)list,
               __position,(PieceOfCinematography **)&local_228);
    ppPVar6 = (list->
              super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>)
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    *__position._M_current = &piece->super_PieceOfCinematography;
    ppPVar6 = (list->
              super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>)
              ._M_impl.super__Vector_impl_data._M_finish + 1;
    (list->super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = ppPVar6;
  }
  pPVar2 = ppPVar6[-1];
  if (pPVar2 != (PieceOfCinematography *)0x0) {
    this = (Series *)__dynamic_cast(pPVar2,&PieceOfCinematography::typeinfo,&Series::typeinfo,0);
    if (this == (Series *)0x0) {
      this_00 = (Livestream *)
                __dynamic_cast(pPVar2,&PieceOfCinematography::typeinfo,&Livestream::typeinfo,0);
      if (this_00 != (Livestream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"set the month of livestream: ",0x1d);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        std::operator>>((istream *)&std::cin,(string *)&local_248);
        iVar3 = atoi(local_248);
        if (iVar3 - 0xdU < 0xfffffff4) {
          pppPVar1 = &(list->
                      super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppPVar1 = *pppPVar1 + -1;
          pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Invalid month","");
          CustomException::CustomException(pCVar7,&local_110);
          __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
        }
        Livestream::setMonth(this_00,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"set the day of livestream: ",0x1b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        std::operator>>((istream *)&std::cin,(string *)&local_248);
        iVar3 = atoi(local_248);
        if (iVar3 - 0x20U < 0xffffffe1) {
          pppPVar1 = &(list->
                      super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppPVar1 = *pppPVar1 + -1;
          pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Invalid day","");
          CustomException::CustomException(pCVar7,&local_130);
          __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
        }
        Livestream::setDay(this_00,iVar3);
        local_220 = 0;
        local_218[0] = 0;
        local_228 = (Series *)local_218;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"set hour of livestream hh:mm e. g. \"21:37\"",0x2a);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
        std::ostream::put(-0x80);
        std::ostream::flush();
        std::operator>>((istream *)&std::cin,(string *)&local_228);
        if (local_220 < 6) {
          std::__cxx11::string::substr((ulong)local_190,(ulong)&local_228);
          pcVar8 = local_190[0];
          iVar3 = atoi(local_190[0]);
          bVar9 = true;
          if (iVar3 < 0x18) {
            std::__cxx11::string::substr((ulong)local_50,(ulong)&local_228);
            iVar3 = atoi(local_50[0]);
            bVar9 = true;
            if (iVar3 < 0x3c) {
              bVar9 = *(char *)((long)&(local_228->super_PieceOfCinematography).
                                       _vptr_PieceOfCinematography + 2) != ':';
            }
            pcVar8 = local_190[0];
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
              pcVar8 = local_190[0];
            }
          }
          if (pcVar8 != local_180) {
            operator_delete(pcVar8);
          }
          if (!bVar9) {
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1b0,local_228,
                       (undefined1 *)
                       ((long)&(local_228->super_PieceOfCinematography)._vptr_PieceOfCinematography
                       + local_220));
            Livestream::setHour(this_00,&local_1b0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
              operator_delete(local_1b0._M_dataplus._M_p);
            }
            if (local_228 != (Series *)local_218) {
              operator_delete(local_228);
            }
            goto LAB_00109e91;
          }
        }
        pppPVar1 = &(list->
                    super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + -1;
        pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Invalid hour","");
        CustomException::CustomException(pCVar7,&local_150);
        __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"set the year the show ended:",0x1c);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
      std::ostream::put(-0x80);
      std::ostream::flush();
      std::operator>>((istream *)&std::cin,(string *)&local_248);
      iVar4 = atoi(local_248);
      if (iVar4 < 0) {
        pppPVar1 = &(list->
                    super__Vector_base<PieceOfCinematography_*,_std::allocator<PieceOfCinematography_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + -1;
        pCVar7 = (CustomException *)__cxa_allocate_exception(0x20);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_f0,"Year the show ended can not be lower than 0","");
        CustomException::CustomException(pCVar7,&local_f0);
        __cxa_throw(pCVar7,&CustomException::typeinfo,CustomException::~CustomException);
      }
      Series::setYearTheShowEnded(this,iVar4);
      Series::setNumberOfSeasons(this,(iVar4 - iVar3) + 1);
    }
  }
LAB_00109e91:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_218 + 0x10));
  if (local_248 != local_238) {
    operator_delete(local_248);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  if (local_1f0 != local_1e8._M_local_buf + 8) {
    operator_delete(local_1f0);
  }
  return;
}

Assistant:

static void addPiece(T *piece, vector<PieceOfCinematography *> &list) {
        string title;
        double rating;
        int numberOfVotes, yearProduced, duration;
        string genre;
        string inputValue;
        vector<string> genres;
        try {
            piece->setFollowed(0);
            piece->setId(list.size() + 1);
            cout << "set the title of the piece of cinematography:" << endl;
            cin >> title;
            piece->setTitle(title);
            cout << "set the rating for the piece of cinematography:" << endl;
            cin >> inputValue;
            rating = atof(inputValue.c_str());
            if(rating>10 || rating<0) throw CustomException("wrong rating");
            piece->setRating(rating);
            cout << "set the number of votes for the piece of cinematography:" << endl;
            cin >> inputValue;
            numberOfVotes = atoi(inputValue.c_str());
            if(numberOfVotes<0) throw CustomException("Number of votes can not be lower than 0");
            piece->setNumberOfVotes(numberOfVotes);
            cout << "set the year of production for the piece of cinematography:" << endl;
            cin >> inputValue;
            yearProduced=atoi(inputValue.c_str());
            if(yearProduced<0) throw CustomException("Year of production can not be lower than 0");
            piece->setYearProduced(yearProduced);
            cout << "set the duration of the piece of cinematography:" << endl;
            cin >> inputValue;
            duration=atoi(inputValue.c_str());
            if(duration<0) throw CustomException("Duration can not be lower than 0");
            piece->setDuration(duration);
            cout << "set the genres of the piece of cinematography:" << endl;
            cout << "To set each genre type it and then press enter." << endl;
            cout << "To finish setting the genres type \"apply\" and press enter." << endl;
            while (cin >> genre) {
                if (genre == "apply") break;
                genres.push_back(genre);
            }
            piece->setGenres(genres);
            list.push_back(dynamic_cast<T *>(piece));
            if (instanceof<Series>(list[list.size() - 1])) {
                Series *s = dynamic_cast<Series *>(list[list.size() - 1]);
                int yearTheShowEnded = 0;
                cout << "set the year the show ended:" << endl;
                cin >> inputValue;
                yearTheShowEnded = atoi(inputValue.c_str());
                if(yearTheShowEnded<0){
                    list.pop_back();
                    throw CustomException("Year the show ended can not be lower than 0");
                }
                s->setYearTheShowEnded(yearTheShowEnded);
                s->setNumberOfSeasons(yearTheShowEnded - yearProduced + 1);
            } else if (instanceof<Livestream>(list[list.size() - 1])) {
                Livestream *l = dynamic_cast<Livestream *>(list[list.size() - 1]);
                int month;
                cout << "set the month of livestream: " << endl;
                cin >> inputValue;
                month = atoi(inputValue.c_str());
                if(month<1 || month >12){
                    list.pop_back();
                    throw CustomException("Invalid month");
                }
                l->setMonth(month);
                cout << "set the day of livestream: " << endl;
                int day;
                cin >> inputValue;
                day = atoi(inputValue.c_str());
                if(day<1 || day >31){
                    list.pop_back();
                    throw CustomException("Invalid day");
                }
                l->setDay(day);
                string hour;
                cout << "set hour of livestream hh:mm e. g. \"21:37\"" << endl;
                cin >> hour;
                if(hour.size()>5 || atoi(hour.substr(0,2).c_str())>23 || atoi(hour.substr(3,2).c_str())>59 || hour[2]!=':'){
                    list.pop_back();
                    throw CustomException("Invalid hour");
                }
                l->setHour(hour);
            }
        } catch(CustomException &e){
            cout<<e.getMessage()<<endl<<endl;
        }
    }